

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  U32 UVar1;
  U32 UVar2;
  size_t *psVar3;
  size_t sVar4;
  bool bVar5;
  BYTE *local_130;
  uint local_124;
  uint local_120;
  long lStack_118;
  U32 mIndex;
  BYTE *match;
  size_t matchLength;
  U32 *nextPtr;
  size_t bestLength;
  U32 dummy32;
  U32 matchEndIdx;
  U32 *largerPtr;
  U32 *smallerPtr;
  BYTE *prefixStart;
  BYTE *dictEnd;
  long lStack_c8;
  U32 dictLimit;
  BYTE *dictBase;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  uint *puStack_a8;
  U32 nextCandidateIdx;
  U32 *nextCandidateIdxPtr;
  uint local_98;
  U32 previousCandidate;
  U32 nbCandidates;
  U32 nbCompares;
  U32 *unsortedMark;
  U32 *nextCandidate;
  U32 unsortLimit;
  U32 btLow;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  U32 windowLow;
  U32 current;
  BYTE *base;
  size_t sStack_50;
  U32 matchIndex;
  size_t h;
  U32 *pUStack_40;
  U32 hashLog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  ZSTD_dictMode_e dictMode_local;
  U32 mls_local;
  size_t *offsetPtr_local;
  BYTE *iend_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  
  hashTable = &(ms->cParams).windowLog;
  pUStack_40 = ms->hashTable;
  h._4_4_ = (ms->cParams).hashLog;
  cParams._0_4_ = dictMode;
  cParams._4_4_ = mls;
  _dictMode_local = offsetPtr;
  offsetPtr_local = (size_t *)iend;
  iend_local = ip;
  ip_local = (BYTE *)ms;
  sStack_50 = ZSTD_hashPtr(ip,h._4_4_,mls);
  base._4_4_ = pUStack_40[sStack_50];
  _windowLow = *(long *)(ip_local + 8);
  bt._4_4_ = (int)iend_local - (int)_windowLow;
  bt._0_4_ = ZSTD_getLowestMatchIndex((ZSTD_matchState_t *)ip_local,bt._4_4_,*hashTable);
  _btMask = *(long *)(ip_local + 0x40);
  btLow = hashTable[1] - 1;
  unsortLimit = (1 << ((byte)btLow & 0x1f)) - 1;
  if (unsortLimit < bt._4_4_) {
    local_120 = bt._4_4_ - unsortLimit;
  }
  else {
    local_120 = 0;
  }
  nextCandidate._4_4_ = local_120;
  local_124 = (U32)bt;
  if ((U32)bt < local_120) {
    local_124 = local_120;
  }
  nextCandidate._0_4_ = local_124;
  unsortedMark = (U32 *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4);
  _nbCandidates = (uint *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4 + 4);
  previousCandidate = 1 << ((byte)hashTable[3] & 0x1f);
  nextCandidateIdxPtr._4_4_ = 0;
  local_98 = previousCandidate;
  if (offsetPtr_local + -1 < iend_local) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3fdb,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  while( true ) {
    bVar5 = false;
    if ((local_124 < base._4_4_) && (bVar5 = false, *_nbCandidates == 1)) {
      bVar5 = 1 < local_98;
    }
    if (!bVar5) break;
    *_nbCandidates = nextCandidateIdxPtr._4_4_;
    nextCandidateIdxPtr._4_4_ = base._4_4_;
    base._4_4_ = *unsortedMark;
    unsortedMark = (U32 *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4);
    _nbCandidates = (uint *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4 + 4);
    local_98 = local_98 - 1;
  }
  if ((local_124 < base._4_4_) && (*_nbCandidates == 1)) {
    *_nbCandidates = 0;
    *unsortedMark = 0;
  }
  base._4_4_ = nextCandidateIdxPtr._4_4_;
  while (base._4_4_ != 0) {
    puStack_a8 = (uint *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4 + 4);
    commonLengthSmaller._4_4_ = *puStack_a8;
    ZSTD_insertDUBT1((ZSTD_matchState_t *)ip_local,base._4_4_,(BYTE *)offsetPtr_local,local_98,
                     (uint)nextCandidate,(ZSTD_dictMode_e)cParams);
    local_98 = local_98 + 1;
    base._4_4_ = commonLengthSmaller._4_4_;
  }
  commonLengthLarger = 0;
  dictBase = (BYTE *)0x0;
  lStack_c8 = *(long *)(ip_local + 0x10);
  dictEnd._4_4_ = *(uint *)(ip_local + 0x18);
  prefixStart = (BYTE *)(lStack_c8 + (ulong)dictEnd._4_4_);
  smallerPtr = (U32 *)(_windowLow + (ulong)dictEnd._4_4_);
  largerPtr = (U32 *)(_btMask + (ulong)((bt._4_4_ & unsortLimit) << 1) * 4);
  bestLength._4_4_ = bt._4_4_ + 9;
  nextPtr = (U32 *)0x0;
  base._4_4_ = pUStack_40[sStack_50];
  pUStack_40[sStack_50] = bt._4_4_;
  _dummy32 = (size_t *)(_btMask + (ulong)((bt._4_4_ & unsortLimit) << 1) * 4 + 4);
  do {
    UVar1 = previousCandidate - 1;
    bVar5 = previousCandidate == 0;
    previousCandidate = UVar1;
    if (bVar5 || base._4_4_ <= (U32)bt) {
LAB_001f691d:
      *(undefined4 *)_dummy32 = 0;
      *largerPtr = 0;
      if (((ZSTD_dictMode_e)cParams == ZSTD_dictMatchState) && (previousCandidate != 0)) {
        nextPtr = (U32 *)ZSTD_DUBT_findBetterDictMatch
                                   ((ZSTD_matchState_t *)ip_local,iend_local,(BYTE *)offsetPtr_local
                                    ,_dictMode_local,(size_t)nextPtr,previousCandidate,cParams._4_4_
                                    ,ZSTD_dictMatchState);
      }
      if (bt._4_4_ + 8 < bestLength._4_4_) {
        *(uint *)(ip_local + 0x24) = bestLength._4_4_ - 8;
        return (size_t)nextPtr;
      }
      __assert_fail("matchEndIdx > current+8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4045,
                    "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                   );
    }
    psVar3 = (size_t *)(_btMask + (ulong)((base._4_4_ & unsortLimit) << 1) * 4);
    if (commonLengthLarger < dictBase) {
      local_130 = (BYTE *)commonLengthLarger;
    }
    else {
      local_130 = dictBase;
    }
    if (((ZSTD_dictMode_e)cParams == ZSTD_extDict) &&
       (local_130 + base._4_4_ < (BYTE *)(ulong)dictEnd._4_4_)) {
      lStack_118 = lStack_c8 + (ulong)base._4_4_;
      sVar4 = ZSTD_count_2segments
                        (iend_local + (long)local_130,local_130 + lStack_118,(BYTE *)offsetPtr_local
                         ,prefixStart,(BYTE *)smallerPtr);
      match = local_130 + sVar4;
      if ((BYTE *)(ulong)dictEnd._4_4_ <= match + base._4_4_) {
        lStack_118 = _windowLow + (ulong)base._4_4_;
      }
    }
    else {
      lStack_118 = _windowLow + (ulong)base._4_4_;
      sVar4 = ZSTD_count(iend_local + (long)local_130,local_130 + lStack_118,(BYTE *)offsetPtr_local
                        );
      match = local_130 + sVar4;
    }
    if (nextPtr < match) {
      if ((BYTE *)(ulong)(bestLength._4_4_ - base._4_4_) < match) {
        bestLength._4_4_ = base._4_4_ + (int)match;
      }
      UVar1 = ZSTD_highbit32((bt._4_4_ - base._4_4_) + 1);
      UVar2 = ZSTD_highbit32((int)*_dictMode_local + 1);
      if ((int)(UVar1 - UVar2) < ((int)match - (int)nextPtr) * 4) {
        nextPtr = (U32 *)match;
        *_dictMode_local = (ulong)((bt._4_4_ + 2) - base._4_4_);
      }
      if ((size_t *)(iend_local + (long)match) == offsetPtr_local) {
        if ((ZSTD_dictMode_e)cParams == ZSTD_dictMatchState) {
          previousCandidate = 0;
        }
        goto LAB_001f691d;
      }
    }
    if (match[lStack_118] < iend_local[(long)match]) {
      *largerPtr = base._4_4_;
      commonLengthLarger = (size_t)match;
      if (base._4_4_ <= nextCandidate._4_4_) {
        largerPtr = (U32 *)&bestLength;
        goto LAB_001f691d;
      }
      largerPtr = (U32 *)((long)psVar3 + 4);
      base._4_4_ = *(uint *)((long)psVar3 + 4);
    }
    else {
      *(U32 *)_dummy32 = base._4_4_;
      dictBase = match;
      if (base._4_4_ <= nextCandidate._4_4_) {
        _dummy32 = &bestLength;
        goto LAB_001f691d;
      }
      base._4_4_ = (U32)*psVar3;
      _dummy32 = psVar3;
    }
  } while( true );
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offsetPtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, current, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offsetPtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}